

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<int>(int *first,int *last,int *x)

{
  int iVar1;
  
  switch((uint)((int)last - (int)first) >> 2 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_00118640:
      *first = iVar1;
      first = first + 1;
switchD_00118621_caseD_6:
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_0011864e:
      *first = iVar1;
      first = first + 1;
switchD_00118621_caseD_4:
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_0011865c:
      *first = iVar1;
      first = first + 1;
switchD_00118621_caseD_2:
      iVar1 = *x;
      *first = iVar1;
      first = first + 1;
LAB_0011866a:
      *first = iVar1;
    }
    break;
  case 1:
    iVar1 = *x;
    goto LAB_0011866a;
  case 2:
    goto switchD_00118621_caseD_2;
  case 3:
    iVar1 = *x;
    goto LAB_0011865c;
  case 4:
    goto switchD_00118621_caseD_4;
  case 5:
    iVar1 = *x;
    goto LAB_0011864e;
  case 6:
    goto switchD_00118621_caseD_6;
  case 7:
    iVar1 = *x;
    goto LAB_00118640;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}